

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_base_z2_row_access<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
               (void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  bool bVar1;
  reference witness;
  column_content<typename_Matrix<Base_options_with_row_access<true,_(Column_types)7,_false,_true,_true,_true>_>::Column>
  local_2e8;
  reference local_2b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  allocator<unsigned_int> local_28d;
  uint i;
  iterator local_288;
  size_type local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  allocator<unsigned_int> local_259;
  uint local_258 [6];
  iterator local_240;
  size_type local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_230;
  allocator<unsigned_int> local_215;
  uint local_214;
  iterator local_210;
  size_type local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  allocator<unsigned_int> local_1e1;
  uint local_1e0 [2];
  iterator local_1d8;
  size_type local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  allocator<unsigned_int> local_1a9;
  uint local_1a8 [8];
  iterator local_188;
  size_type local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  allocator<unsigned_int> local_159;
  uint local_158 [6];
  iterator local_140;
  size_type local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  undefined1 local_118 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  undefined1 local_f0 [8];
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>
              *)local_f0,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_118);
  local_158[0] = 3;
  local_158[1] = 6;
  local_158[2] = 9;
  local_158[3] = 10;
  local_158[4] = 0xb;
  local_140 = local_158;
  local_138 = 5;
  std::allocator<unsigned_int>::allocator(&local_159);
  __l_04._M_len = local_138;
  __l_04._M_array = local_140;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_130,__l_04,&local_159);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_118,&local_130);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_130);
  std::allocator<unsigned_int>::~allocator(&local_159);
  local_1a8[0] = 3;
  local_1a8[1] = 5;
  local_1a8[2] = 8;
  local_1a8[3] = 9;
  local_1a8[4] = 0xb;
  local_188 = local_1a8;
  local_180 = 5;
  std::allocator<unsigned_int>::allocator(&local_1a9);
  __l_03._M_len = local_180;
  __l_03._M_array = local_188;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_178,__l_03,&local_1a9);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_118,&local_178);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_178);
  std::allocator<unsigned_int>::~allocator(&local_1a9);
  local_1e0[0] = 5;
  local_1e0[1] = 8;
  local_1d8 = local_1e0;
  local_1d0 = 2;
  std::allocator<unsigned_int>::allocator(&local_1e1);
  __l_02._M_len = local_1d0;
  __l_02._M_array = local_1d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1c8,__l_02,&local_1e1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_118,&local_1c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1c8);
  std::allocator<unsigned_int>::~allocator(&local_1e1);
  local_214 = 7;
  local_210 = &local_214;
  local_208 = 1;
  std::allocator<unsigned_int>::allocator(&local_215);
  __l_01._M_len = local_208;
  __l_01._M_array = local_210;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_200,__l_01,&local_215);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_118,&local_200);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_200);
  std::allocator<unsigned_int>::~allocator(&local_215);
  local_258[4] = 10;
  local_258[5] = 0xb;
  local_258[0] = 3;
  local_258[1] = 6;
  local_258[2] = 7;
  local_258[3] = 9;
  local_240 = local_258;
  local_238 = 6;
  std::allocator<unsigned_int>::allocator(&local_259);
  __l_00._M_len = local_238;
  __l_00._M_array = local_240;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_230,__l_00,&local_259);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_118,&local_230);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_230);
  std::allocator<unsigned_int>::~allocator(&local_259);
  i = 7;
  local_288 = &i;
  local_280 = 1;
  std::allocator<unsigned_int>::allocator(&local_28d);
  __l._M_len = local_280;
  __l._M_array = local_288;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_278,__l,&local_28d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_118,&local_278);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_278);
  std::allocator<unsigned_int>::~allocator(&local_28d);
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_118);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_118);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&r);
    if (!bVar1) break;
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end1);
    local_2b8 = witness;
    get_ordered_row<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
              (&local_2e8,
               (Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
                *)local_f0,__range1._4_4_);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
              (witness,&local_2e8);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_2e8)
    ;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_118);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
  ::~Matrix((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
             *)local_f0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_base_z2_row_access() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<std::vector<unsigned int> > rows;
  if constexpr (Matrix::Option_list::has_column_compression) {
    // if the union find structure changes, the column_index values of the entries could also change. Change the test
    // with all possibilities?
    rows.push_back({3, 6});
    rows.push_back({3, 5});
    rows.push_back({5});
    rows.push_back({7});
    rows.push_back({3, 6, 7});
    rows.push_back({7});
  } else {
    rows.push_back({3, 6, 9, 10, 11});
    rows.push_back({3, 5, 8, 9, 11});
    rows.push_back({5, 8});
    rows.push_back({7});
    rows.push_back({3, 6, 7, 9, 10, 11});
    rows.push_back({7});
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}